

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::IsRFC6052(CNetAddr *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  array<unsigned_char,_12UL> local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV6) {
    local_14._M_elems[0] = '\0';
    local_14._M_elems[1] = 'd';
    local_14._M_elems[2] = 0xff;
    local_14._M_elems[3] = 0x9b;
    local_14._M_elems[4] = '\0';
    local_14._M_elems[5] = '\0';
    local_14._M_elems[6] = '\0';
    local_14._M_elems[7] = '\0';
    local_14._M_elems[8] = '\0';
    local_14._M_elems[9] = '\0';
    local_14._M_elems[10] = '\0';
    local_14._M_elems[0xb] = '\0';
    bVar1 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,12ul>
                      (&this->m_addr,&local_14);
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC6052() const
{
    return IsIPv6() &&
           HasPrefix(m_addr, std::array<uint8_t, 12>{0x00, 0x64, 0xFF, 0x9B, 0x00, 0x00,
                                                     0x00, 0x00, 0x00, 0x00, 0x00, 0x00});
}